

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O2

Input * __thiscall
helics::ValueFederateManager::getInput(ValueFederateManager *this,string_view key)

{
  Input *pIVar1;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> inpF;
  shared_handle inpHandle;
  BlockIterator<const_helics::Input,_32,_const_helics::Input_*const_*> local_60;
  shared_handle local_48;
  const_iterator local_30;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock_shared(&local_48,&this->inputs);
  gmlc::containers::
  DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (&local_60,local_48.data,key);
  gmlc::containers::StableBlockVector<helics::Input,_5U,_std::allocator<helics::Input>_>::end
            (&local_30,&(local_48.data)->dataStorage);
  pIVar1 = (Input *)invalidIpt;
  if (local_60.vec != local_30.vec) {
    pIVar1 = local_60.ptr;
  }
  if (local_60.offset != local_30.offset) {
    pIVar1 = local_60.ptr;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_48.m_handle_lock);
  return pIVar1;
}

Assistant:

const Input& ValueFederateManager::getInput(std::string_view key) const
{
    auto inpHandle = inputs.lock_shared();
    auto inpF = inpHandle->find(key);
    if (inpF != inpHandle->end()) {
        return *inpF;
    }
    return invalidIpt;
}